

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O1

int dog_move(monst *mtmp,int after)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uchar uVar5;
  permonst *ppVar6;
  undefined1 auVar7 [16];
  boolean bVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  uint uVar12;
  int iVar13;
  obj *poVar14;
  coord *pcVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  trap *ptVar16;
  char cVar17;
  uint uVar18;
  monst *pmVar19;
  xchar xVar20;
  char cVar21;
  int iVar22;
  long lVar23;
  char cVar24;
  char *pcVar25;
  monst *pmVar26;
  monst *obj;
  char *pcVar27;
  int iVar28;
  ulong uVar29;
  obj **obj_00;
  ulong uVar30;
  ulong uVar31;
  char cVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  coord cc;
  boolean cursemsg [9];
  coord poss [9];
  long info [9];
  coord local_152;
  monst *local_150;
  ulong local_148;
  uint local_140;
  uint local_13c;
  undefined8 local_138;
  int local_130;
  uint local_12c;
  int local_128;
  int local_124;
  ulong local_120;
  obj *local_118;
  long local_110;
  long local_108;
  int local_fc;
  int local_f8;
  char local_f1 [9];
  long local_e8;
  ulong local_e0;
  undefined4 local_d8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  permonst *local_a0;
  permonst *local_98;
  permonst *local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  
  local_13c = *(uint *)&mtmp->field_0x60;
  cVar1 = mtmp->mx;
  cVar2 = mtmp->my;
  if (((local_13c >> 0x1a & 1) == 0) &&
     (iVar22 = *(int *)((long)&mtmp[1].data + 4), iVar22 + 500U < moves)) {
    if ((mtmp->data->mflags1 & 0x60000000) == 0) {
      *(uint *)((long)&mtmp[1].data + 4) = moves + 500;
      goto LAB_00174b55;
    }
    if (*(int *)&mtmp[1].minvent == 0) {
      iVar22 = mtmp->mhpmax / 3;
      *(uint *)&mtmp->field_0x60 = local_13c | 0x200000;
      *(int *)&mtmp[1].minvent = mtmp->mhpmax - iVar22;
      mtmp->mhpmax = iVar22;
      if (iVar22 < mtmp->mhp) {
        mtmp->mhp = iVar22;
      }
      if (0 < mtmp->mhp) {
        if ((viz_array[cVar2][cVar1] & 2U) == 0) {
          if ((viz_array[cVar2][cVar1] & 1U) == 0) {
            pcVar25 = y_monnam(mtmp);
            pcVar27 = "You feel worried about %s.";
            goto LAB_00174b3f;
          }
          beg(mtmp);
        }
        else {
          pcVar25 = Monnam(mtmp);
          pcVar27 = "%s is confused from hunger.";
LAB_00174b3f:
          pline(pcVar27,pcVar25);
        }
        stop_occupation();
        goto LAB_00174b55;
      }
    }
    else if ((moves <= iVar22 + 0x2eeU) && (0 < mtmp->mhp)) goto LAB_00174b55;
    if (((mtmp->field_0x63 & 1) == 0) || (u.usteed == mtmp)) {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        pcVar25 = "sad";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar25 = "bummed";
          }
          else {
            bVar8 = dmgtype(youmonst.data,0x24);
            pcVar25 = "sad";
            if (bVar8 == '\0') {
              pcVar25 = "bummed";
            }
          }
        }
        pcVar27 = "You feel %s for a moment.";
      }
      else {
        pcVar25 = Monnam(mtmp);
        pcVar27 = "%s starves.";
      }
      pline(pcVar27,pcVar25);
    }
    else {
      pline("Your leash goes slack.");
    }
    mondied(mtmp);
LAB_0017544f:
    local_150 = (monst *)0x2;
    goto LAB_00176345;
  }
LAB_00174b55:
  local_130 = (int)cVar1;
  local_12c = (uint)cVar2;
  pmVar26 = (monst *)(ulong)local_12c;
  local_88 = (long)cVar2;
  local_80 = (long)cVar1;
  uVar9 = dist2(local_130,local_12c,(int)u.ux,(int)u.uy);
  if (u.usteed != mtmp) {
    uVar30 = (ulong)uVar9;
    if (uVar9 != 0) goto LAB_00174bd8;
LAB_001755c2:
    local_150 = (monst *)0x0;
    goto LAB_00176345;
  }
  uVar30 = 1;
  if (u.uprops[0x15].extrinsic == 0 && u.uprops[0x15].intrinsic == 0) {
LAB_00174bd8:
    pmVar19 = (monst *)0x0;
    local_f1[0] = '\0';
    local_78 = 0;
    cVar21 = cVar1;
    cVar17 = cVar2;
    if ((local_13c >> 0x1a & 1) == 0) {
      uVar9 = *(uint *)&mtmp->field_0x60 & 0xc0000;
      pcVar25 = (char *)(ulong)uVar9;
      obj = pmVar26;
      if (uVar9 == 0x40000) {
        uVar9 = (uint)mtmp->mx;
        pmVar19 = (monst *)(ulong)uVar9;
        iVar22 = (int)mtmp->my;
        poVar14 = DROPPABLES(mtmp);
        iVar28 = (int)uVar30;
        if (poVar14 == (obj *)0x0) {
          local_138 = (long)(int)uVar9;
          pcVar25 = level->levname + local_138 * 0xa8;
          obj = *(monst **)(pcVar25 + (long)iVar22 * 8 + 0x4f00);
          if (obj != (monst *)0x0) {
            uVar12 = (uint)*(char *)((long)&obj->mspec_used + 1);
            pmVar26 = (monst *)(ulong)uVar12;
            pcVar25 = (char *)memchr("\x0f\x10\x0e",uVar12,4);
            if ((pcVar25 == (char *)0x0) &&
               (((obj->mtrack[3].y & 0x20U) == 0 ||
                (uVar12 = (ushort)*(short *)((long)&obj->m_id + 2) - 0xda,
                pcVar25 = (char *)(ulong)uVar12, (ushort)uVar12 < 3)))) {
              iVar10 = dogfood(mtmp,(obj *)obj);
              if (((iVar10 < 2) || ((iVar10 == 2 && (*(int *)&mtmp[1].minvent != 0)))) &&
                 (bVar8 = could_reach_item(mtmp,(xchar)obj->m_id,*(xchar *)((long)&obj->m_id + 1)),
                 bVar8 != '\0')) {
                bVar34 = false;
                uVar9 = dog_eat(mtmp,(obj *)obj,uVar9,iVar22,'\0');
                pcVar25 = (char *)(ulong)uVar9;
                pmVar19 = (monst *)(ulong)uVar9;
              }
              else {
                pmVar26 = obj;
                bVar8 = can_carry(mtmp,(obj *)obj);
                pcVar25 = (char *)CONCAT71(extraout_var,bVar8);
                if ((bVar8 != '\0') && ((obj->mtrack[3].x & 1U) == 0)) {
                  cVar32 = (char)obj->m_id;
                  pmVar26 = (monst *)(ulong)(uint)(int)cVar32;
                  bVar8 = could_reach_item(mtmp,cVar32,*(xchar *)((long)&obj->m_id + 1));
                  pcVar25 = (char *)CONCAT71(extraout_var_00,bVar8);
                  if (bVar8 != '\0') {
                    uVar12 = mt_random();
                    pcVar25 = (char *)0x0;
                    if ((int)(uVar12 % 0x14) < *(int *)((long)&mtmp[1].nmon + 4) + 3) {
                      uVar12 = mt_random();
                      if (SUB168(ZEXT416(uVar12) % SEXT816((long)iVar28),0) == 0) {
                        local_120 = (ulong)*(int *)((long)&mtmp[1].nmon + 4);
                        uVar12 = mt_random();
                        pcVar25 = SUB168(ZEXT416(uVar12) / SEXT816((long)local_120),0);
                        if (SUB168(ZEXT416(uVar12) % SEXT816((long)local_120),0) != 0)
                        goto LAB_00176776;
                      }
                      if (((viz_array[iVar22][local_138] & 2U) != 0) && (flags.verbose != '\0')) {
                        pcVar25 = Monnam(mtmp);
                        pcVar27 = distant_name((obj *)obj,doname);
                        pline("%s picks up %s.",pcVar25,pcVar27);
                      }
                      obj_extract_self((obj *)obj);
                      newsym(uVar9,iVar22);
                      mpickobj(mtmp,(obj *)obj);
                      bVar8 = attacktype(mtmp->data,0xfe);
                      bVar34 = true;
                      if ((bVar8 != '\0') && (mtmp->weapon_check == '\x01')) {
                        mtmp->weapon_check = '\x03';
                        mon_wield_item(mtmp);
                      }
                      obj = mtmp;
                      m_dowear(level,mtmp,'\0');
                      pcVar25 = extraout_RAX;
                      pmVar19 = mtmp;
                      goto LAB_00176779;
                    }
                  }
                }
LAB_00176776:
                obj = pmVar26;
                bVar34 = true;
              }
LAB_00176779:
              pmVar26 = obj;
              if (!bVar34) goto LAB_00174d52;
            }
          }
        }
        else {
          uVar9 = mt_random();
          if (SUB168(ZEXT416(uVar9) % SEXT816((long)(iVar28 + 1)),0) != 0) {
            iVar22 = *(int *)((long)&mtmp[1].nmon + 4);
            uVar9 = mt_random();
            auVar7 = SEXT816((long)iVar22);
            pcVar25 = SUB168(ZEXT416(uVar9) / auVar7,0);
            if (SUB168(ZEXT416(uVar9) % auVar7,0) != 0) goto LAB_00174d4f;
          }
          uVar9 = mt_random();
          pcVar25 = (char *)0x0;
          if ((int)(uVar9 % 10) < *(int *)((long)&mtmp[1].nmon + 4)) {
            uVar9 = *(uint *)&mtmp->field_0x60 >> 1 & 1;
            pmVar26 = (monst *)(ulong)uVar9;
            relobj(mtmp,uVar9,'\x01');
            iVar22 = *(int *)((long)&mtmp[1].nmon + 4);
            if (1 < iVar22) {
              *(int *)((long)&mtmp[1].nmon + 4) = iVar22 + -1;
            }
            *(int *)&mtmp[1].nmon = iVar28;
            pcVar25 = (char *)(ulong)moves;
            *(uint *)&mtmp->field_0x74 = moves;
          }
        }
LAB_00174d4f:
        pmVar19 = (monst *)0x0;
        obj = pmVar26;
      }
LAB_00174d52:
      if ((int)pmVar19 != 1) {
        local_150 = pmVar19;
        if ((int)pmVar19 == 2) goto LAB_00176345;
        uVar9 = moves - *(int *)&mtmp[1].data;
        local_b8 = (ulong)CONCAT31((int3)(uVar9 >> 8),uVar9 < 5);
        pmVar19 = (monst *)&mtmp->field_0x74;
        goto LAB_00174d97;
      }
      iVar22 = -1;
      local_118 = (obj *)CONCAT44(local_118._4_4_,(int)CONCAT71((int7)((ulong)pcVar25 >> 8),1));
      pmVar26 = (monst *)0x0;
    }
    else {
      local_b8 = 0;
LAB_00174d97:
      local_f8 = -2;
      local_fc = after;
      if (u.usteed == mtmp) goto LAB_001755b6;
      cVar32 = mtmp->mx;
      lVar33 = (long)cVar32;
      cVar3 = mtmp->my;
      lVar23 = (long)cVar3;
      local_e0 = CONCAT71(local_e0._1_7_,viz_array[lVar23][lVar33]);
      local_b0 = uVar30;
      local_118 = DROPPABLES(mtmp);
      local_150 = pmVar19;
      local_110 = lVar33;
      local_108 = lVar23;
      if ((pmVar19 == (monst *)0x0) || ((mtmp->field_0x63 & 1) != 0)) {
        gtyp = '\x04';
        gx = u.ux;
        gy = u.uy;
      }
      else {
        gtyp = '\x06';
        gy = '\0';
        gx = '\0';
        local_124 = 6;
        if (6 < cVar32) {
          local_124 = (int)cVar32;
        }
        iVar22 = 0x4a;
        if (cVar32 < 0x4a) {
          iVar22 = (int)cVar32;
        }
        local_148 = CONCAT44(local_148._4_4_,iVar22);
        local_140 = 5;
        if (5 < cVar3) {
          local_140 = (int)cVar3;
        }
        local_128 = 0xf;
        if (cVar3 < 0xf) {
          local_128 = (int)cVar3;
        }
        poVar14 = level->objlist;
        if (poVar14 != (obj *)0x0) {
          local_124 = local_124 + -5;
          local_148 = CONCAT44(local_148._4_4_,iVar22 + 5);
          local_140 = local_140 - 5;
          local_128 = local_128 + 5;
          local_e8 = lVar33 * 0xfc;
          local_c0 = lVar23 * 3;
          do {
            cVar32 = poVar14->ox;
            local_138 = CONCAT71(local_138._1_7_,cVar32);
            iVar22 = (int)cVar32;
            if ((local_124 <= iVar22) && (iVar22 <= (int)local_148)) {
              cVar3 = poVar14->oy;
              local_120 = CONCAT71(local_120._1_7_,cVar3);
              iVar28 = (int)cVar3;
              if (((int)local_140 <= iVar28) && (iVar28 <= local_128)) {
                iVar10 = dogfood(mtmp,poVar14);
                if ((iVar10 << 0x18 != 0x6000000) && (xVar20 = (xchar)iVar10, xVar20 <= gtyp)) {
                  for (pmVar26 = (monst *)level->objects[(char)local_138][(char)local_120];
                      pmVar26 != (monst *)0x0; pmVar26 = ((vptrs *)&pmVar26->data)->v_ocarry) {
                    if ((pmVar26->mtrack[3].x & 1U) != 0) {
                      if (('\x02' < xVar20) || (*(int *)((long)&local_150->minvent + 4) == 0))
                      goto LAB_00175103;
                      break;
                    }
                  }
                  bVar8 = could_reach_item(mtmp,cVar32,cVar3);
                  if ((bVar8 != '\0') &&
                     (bVar8 = can_reach_location(mtmp,mtmp->mx,mtmp->my,cVar32,cVar3), bVar8 != '\0'
                     )) {
                    if (xVar20 < '\x03') {
                      if (gtyp <= xVar20) {
                        iVar13 = (int)local_110;
                        iVar10 = (int)local_108;
                        iVar22 = dist2(iVar22,iVar28,iVar13,iVar10);
                        iVar28 = dist2((int)gx,(int)gy,iVar13,iVar10);
                        if (iVar28 <= iVar22) goto LAB_00175103;
                      }
LAB_001750e9:
                      gx = (char)local_138;
                      gy = (char)local_120;
                      gtyp = xVar20;
                    }
                    else if (((((local_118 == (obj *)0x0 && (local_e0 & 1) != 0) && gtyp == '\x06')
                              && ((((&level->locations[0][0].field_0x7)[local_c0 * 4 + local_e8] & 4
                                   ) == 0 || ((level->locations[u.ux][u.uy].field_0x7 & 4) != 0))))
                             && ((iVar10 << 0x18 == 0x3000000 ||
                                 (bVar8 = clear_path((int)mtmp->mx,(int)mtmp->my,iVar22,iVar28),
                                 bVar8 != '\0')))) &&
                            (iVar22 = *(int *)&local_150->data, uVar9 = mt_random(),
                            (int)(uVar9 & 7) < iVar22)) {
                      bVar8 = can_carry(mtmp,poVar14);
                      xVar20 = '\x04';
                      if (bVar8 != '\0') goto LAB_001750e9;
                    }
                  }
                }
              }
            }
LAB_00175103:
            poVar14 = poVar14->nobj;
          } while (poVar14 != (obj *)0x0);
        }
      }
      uVar30 = local_b0;
      pmVar26 = local_150;
      iVar22 = (int)local_b0;
      if ((gtyp == '\x06') ||
         ((iVar28 = 1, (gtyp & 0xfbU) != 0 && (moves < *(uint *)&local_150->dlevel)))) {
        gx = u.ux;
        gy = u.uy;
        if ((local_fc == 0) || (4 < iVar22)) {
          iVar28 = 1;
          if (iVar22 < 9) {
            iVar28 = (*(int *)&mtmp->field_0x60 << 0xf) >> 0x1f;
          }
          if (1 < iVar22) {
            if ('\x18' < level->locations[u.ux][u.uy].typ) {
              uVar9 = mt_random();
              if (((uVar9 & 3) != 0 && (char)local_b8 == '\0') &&
                 ((local_118 == (obj *)0x0 ||
                  (iVar10 = *(int *)&local_150->data, uVar9 = mt_random(), pmVar26 = local_150,
                  SUB168(ZEXT416(uVar9) % SEXT816((long)iVar10),0) == 0)))) goto LAB_00175219;
            }
            iVar28 = 1;
          }
LAB_00175219:
          if (iVar28 == 0) {
            obj_00 = &invent;
            do {
              obj_00 = &((obj *)obj_00)->nobj->nobj;
              if ((obj *)obj_00 == (obj *)0x0) {
                iVar28 = 0;
                pmVar26 = local_150;
                goto LAB_00175276;
              }
              iVar28 = dogfood(mtmp,(obj *)obj_00);
            } while (iVar28 != 0);
            iVar28 = 1;
            pmVar26 = local_150;
          }
          goto LAB_00175276;
        }
      }
      else {
LAB_00175276:
        lVar33 = local_108;
        lVar23 = local_110;
        local_f8 = 0;
        if ((mtmp->field_0x62 & 0x20) == 0) {
          local_f8 = iVar28;
        }
        if (((gx == u.ux) && (gy == u.uy)) &&
           (uVar31 = local_e0 & 1, local_e0 = local_e0 & 0xffffffffffffff01, uVar31 == 0)) {
          iVar28 = (int)local_108;
          iVar10 = (int)local_110;
          pcVar15 = gettrack(iVar10,iVar28);
          if (pcVar15 == (coord *)0x0) {
            if (((pmVar26 == (monst *)0x0) || (gx = *(xchar *)&pmVar26->mw, gx == '\0')) ||
               ((gx == (char)lVar23 && (*(char *)((long)&pmVar26->mw + 1) == (char)lVar33)))) {
              local_d8 = 0x1a44;
              gy = 'R';
              gx = 'R';
              do_clear_area(iVar10,iVar28,9,wantdoor,&local_d8);
              xVar20 = gy;
              if ((gx != 'R') && (gy != (char)lVar33 || gx != (char)lVar23)) {
                if (pmVar26 != (monst *)0x0) {
                  *(xchar *)&pmVar26->mw = gx;
                  *(xchar *)((long)&pmVar26->mw + 1) = xVar20;
                }
                goto LAB_001755bb;
              }
              gx = u.ux;
              gy = u.uy;
            }
            else {
              gy = *(xchar *)((long)&pmVar26->mw + 1);
              *(undefined1 *)&pmVar26->mw = 0;
            }
LAB_001755b6:
            iVar22 = (int)uVar30;
          }
          else {
            gx = pcVar15->x;
            gy = pcVar15->y;
            if (pmVar26 != (monst *)0x0) {
              *(undefined1 *)&pmVar26->mw = 0;
            }
          }
        }
        else if (pmVar26 != (monst *)0x0) {
          *(undefined1 *)&pmVar26->mw = 0;
        }
      }
LAB_001755bb:
      if (local_f8 == -2) goto LAB_001755c2;
      uVar30 = 0x660a0000;
      if ((mtmp->data->mflags1 & 8) == 0) {
        uVar30 = 0x600a0000;
      }
      bVar8 = passes_bars(mtmp->data);
      if ((bVar8 != '\0') || ((int)mtmp->data->mflags1 < 0)) {
        uVar30 = uVar30 | 0x10000000;
      }
      uVar30 = mtmp->data->mflags2 >> 2 & 0x2000000 | uVar30;
      if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
         (iVar28 = resist(mtmp,'\x04',0,0), iVar28 == 0)) {
        if ((local_13c >> 0x1a & 1) != 0) {
          if (mtmp->wormno == '\0') {
            if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))
                )))) goto LAB_001764a5;
LAB_001764f4:
            if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
                 ((poVar14 = which_armor(mtmp,4), poVar14 == (obj *)0x0 ||
                  (poVar14 = which_armor(mtmp,4), poVar14->otyp != 0x4f)))) &&
                ((((u.uprops[0x1e].intrinsic != 0 ||
                   (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                    (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                  (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                   ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                     (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                     youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
                 (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                  (iVar22 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar22 < 0x41)))
                 ))) || (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                         (bVar8 = match_warn_of_mon(mtmp), bVar8 != '\0')))) goto LAB_00176650;
          }
          else {
            bVar8 = worm_known(level,mtmp);
            if (bVar8 == '\0') goto LAB_001764f4;
LAB_001764a5:
            uVar9 = *(uint *)&mtmp->field_0x60;
            if ((((uVar9 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
               (u.uprops[0xc].extrinsic == 0)) {
              if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
              goto LAB_001764e6;
              goto LAB_001764f4;
            }
            if ((uVar9 & 0x280) != 0) goto LAB_001764f4;
LAB_001764e6:
            if ((u._1052_1_ & 0x20) != 0) goto LAB_001764f4;
LAB_00176650:
            pcVar25 = Monnam(mtmp);
            pline("%s rebukes you, saying:",pcVar25);
            verbalize("Since you desire conflict, have some more!");
          }
          mongone(mtmp);
          uVar9 = mt_random();
          iVar22 = (uVar9 & 3) + 1;
          do {
            local_d8._0_2_ = (coord)CONCAT11(u.uy,u.ux);
            bVar8 = enexto((coord *)&local_d8,level,u.ux,u.uy,mons + 0x7f);
            if (bVar8 != '\0') {
              mk_roamer(mons + 0x7f,u.ualign.type,level,(xchar)local_d8,local_d8._1_1_,'\0');
            }
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
          goto LAB_0017544f;
        }
        uVar30 = uVar30 | 0x40000;
      }
      if (((u.uprops[0x15].extrinsic == 0 && u.uprops[0x15].intrinsic == 0) &&
          ((mtmp->field_0x62 & 0x20) == 0)) &&
         ((u.ustuck == mtmp && (bVar8 = sticks(youmonst.data), bVar8 == '\0')))) {
        unstuck(mtmp);
        pline("You get released!");
      }
      if (((mtmp->data->mflags1 & 0x2000) == 0) && (mtmp->data->msize != '\0')) {
        poVar14 = m_carrying(mtmp,0xe2);
        uVar30 = (ulong)(poVar14 != (obj *)0x0) << 0x18 | uVar30 | 0x400000;
      }
      iVar28 = mfndpos(mtmp,(coord *)&local_d8,&local_78,
                       ((mtmp->data->mflags1 & 0x20) << 0x16 | (mtmp->data->mflags2 & 0x4000) << 10)
                       | uVar30);
      cVar32 = (char)iVar28;
      uVar9 = (uint)cVar32;
      if (cVar32 < '\x01') {
        local_138 = (ulong)local_138._4_4_ << 0x20;
      }
      else {
        uVar30 = 0;
        local_138 = (ulong)local_138._4_4_ << 0x20;
        do {
          cVar3 = *(char *)((long)&local_d8 + uVar30 * 2);
          cVar4 = *(char *)((long)&local_d8 + uVar30 * 2 + 1);
          pmVar26 = level->monsters[cVar3][cVar4];
          if (((pmVar26 == (monst *)0x0) || ((pmVar26->field_0x61 & 2) != 0)) ||
             ((*(byte *)((long)&local_78 + uVar30 * 8 + 2) & 8) != 0)) {
            cVar24 = '\x01';
            for (pmVar26 = (monst *)level->objects[cVar3][cVar4]; pmVar26 != (monst *)0x0;
                pmVar26 = ((vptrs *)&pmVar26->data)->v_ocarry) {
              if ((pmVar26->mtrack[3].x & 1U) != 0) {
                cVar24 = '\0';
                break;
              }
            }
            local_138 = CONCAT44(local_138._4_4_,(uint)(byte)((char)local_138 + cVar24));
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar9);
      }
      obj = (monst *)(ulong)local_12c;
      local_128 = dist2(local_130,local_12c,(int)gx,(int)gy);
      iVar28 = 0x11;
      if (0x11 < iVar22) {
        iVar28 = iVar22;
      }
      local_b0 = CONCAT44(local_b0._4_4_,iVar28);
      uVar11 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_128 >> 8),1);
      if (cVar32 < '\x01') {
        local_118 = (obj *)CONCAT44(local_118._4_4_,uVar11);
        iVar22 = -1;
        pmVar26 = (monst *)0x0;
      }
      else {
        local_118 = (obj *)CONCAT44(local_118._4_4_,uVar11);
        local_a4 = (char)local_138 * 0xd;
        uVar12 = uVar9;
        if ((local_13c >> 0x1a & 1) == 0) {
          uVar12 = (int)(char)local_138;
        }
        uVar18 = 3;
        if (uVar12 - 2 < 3) {
          uVar18 = uVar12 - 2;
        }
        local_120 = (ulong)(uVar18 + 1);
        local_e0 = (ulong)uVar12;
        local_c0 = (ulong)uVar12 * 4;
        local_e8 = CONCAT44(local_e8._4_4_,0xffffffff);
        local_90 = mons + 0x1e;
        local_98 = mons + 10;
        local_a0 = mons + 0xdb;
        uVar30 = 0;
        local_150 = (monst *)(mons + 0xdb);
        local_108 = CONCAT71(local_108._1_7_,cVar2);
        local_110 = CONCAT71(local_110._1_7_,cVar1);
        local_140 = 0;
        local_148 = (ulong)uVar9;
        do {
          cVar21 = *(char *)((long)&local_d8 + uVar30 * 2);
          cVar17 = *(char *)((long)&local_d8 + uVar30 * 2 + 1);
          iVar22 = (int)cVar21;
          iVar28 = (int)cVar17;
          local_f1[uVar30] = '\0';
          if (((mtmp->field_0x63 & 1) == 0) ||
             (iVar10 = dist2(iVar22,iVar28,(int)u.ux,(int)u.uy), uVar31 = local_148, iVar10 < 5)) {
            if ((local_13c >> 0x1a & 1) != 0) {
              iVar10 = dist2(iVar22,iVar28,(int)u.ux,(int)u.uy);
              uVar31 = local_148;
              if ((int)local_b0 <= iVar10) goto LAB_00175cce;
            }
            pmVar26 = local_150;
            local_124 = iVar22;
            if (((((uint)(&local_78)[uVar30] >> 0x13 & 1) == 0) ||
                (pmVar19 = level->monsters[cVar21][cVar17], pmVar19 == (monst *)0x0)) ||
               ((pmVar19->field_0x61 & 2) != 0)) {
              if ((((uint)(&local_78)[uVar30] >> 0x11 & 1) != 0) &&
                 (ptVar16 = t_at(level,iVar22,iVar28), ptVar16 != (trap *)0x0)) {
                if ((mtmp->field_0x63 & 1) == 0) {
                  if (((ptVar16->field_0x8 & 0x20) != 0) &&
                     (uVar9 = mt_random(), uVar31 = local_148,
                     0x6666666 < (uVar9 * -0x33333333 >> 3 | uVar9 * -0x60000000)))
                  goto LAB_00175cce;
                }
                else if (flags.soundok != '\0') {
                  whimper(mtmp);
                }
              }
              iVar22 = (int)uVar30;
              if ((local_13c >> 0x1a & 1) == 0) {
                for (pmVar26 = (monst *)level->objects[cVar21][cVar17]; pmVar26 != (monst *)0x0;
                    pmVar26 = ((vptrs *)&pmVar26->data)->v_ocarry) {
                  if ((*(byte *)((long)pmVar26->mtrack + 6) & 1) == 0) {
                    iVar10 = dogfood(mtmp,(obj *)pmVar26);
                    if ((iVar10 * 0x1000000 < 0x2000001) &&
                       ((iVar10 * 0x1000000 != 0x2000000 ||
                        (*(uint *)((long)&mtmp[1].data + 4) <= moves)))) {
                      local_f1[uVar30] = '\0';
                      local_118 = (obj *)((ulong)local_118 & 0xffffffff00000000);
                      obj = local_150;
                      goto LAB_00175e9a;
                    }
                  }
                  else {
                    local_f1[uVar30] = '\x01';
                  }
                }
              }
              if (((local_f1[uVar30] == '\0') ||
                  ((mtmp->field_0x63 & 1) != 0 || (char)local_138 < '\x01')) ||
                 (uVar9 = mt_random(), uVar31 = local_148, uVar9 % local_a4 == 0)) {
                if (1 < (int)local_e0) {
                  uVar29 = 0;
                  lVar23 = local_c0;
                  do {
                    if (((cVar21 == mtmp->mtrack[uVar29].x) && (cVar17 == mtmp->mtrack[uVar29].y))
                       && (uVar9 = mt_random(), uVar31 = local_148,
                          SUB168(ZEXT416(uVar9) % SEXT816(lVar23),0) != 0)) goto LAB_00175cce;
                    uVar29 = uVar29 + 1;
                    lVar23 = lVar23 + -4;
                  } while (local_120 != uVar29);
                }
                iVar28 = dist2(local_124,iVar28,(int)gx,(int)gy);
                iVar10 = (iVar28 - local_128) * local_f8;
                if (iVar10 == 0) {
                  cVar32 = (char)local_140 + '\x01';
                  uVar9 = CONCAT31((int3)(local_140 >> 8),cVar32);
                  uVar12 = mt_random();
                  local_140 = uVar9;
                  if (SUB168(ZEXT416(uVar12) % SEXT816((long)cVar32),0) != 0) goto LAB_00175c4e;
                }
                else if (-1 < iVar10) {
LAB_00175c4e:
                  uVar31 = local_148;
                  if (0 < iVar10 && (char)local_b8 == '\0') {
                    if (((cVar2 == (char)local_108 && cVar1 == (char)local_110) &&
                        (uVar9 = mt_random(), uVar9 * -0x55555555 < 0x55555556)) ||
                       (uVar9 = mt_random(), uVar31 = local_148,
                       (uVar9 * -0x55555555 >> 2 | uVar9 * -0x40000000) < 0x15555556))
                    goto LAB_00175c98;
                  }
                  goto LAB_00175cce;
                }
LAB_00175c98:
                local_140 = local_140 & 0xff;
                if (iVar10 < 0) {
                  local_140 = 0;
                }
                local_110 = CONCAT71(local_110._1_7_,cVar21);
                local_108 = CONCAT71(local_108._1_7_,cVar17);
                local_e8 = CONCAT44(local_e8._4_4_,iVar22);
                uVar31 = local_148;
                local_128 = iVar28;
              }
            }
            else {
              bVar34 = true;
              uVar31 = local_148;
              if ((((uint)pmVar19->m_lev < mtmp->m_lev + 2) &&
                  (((((pmVar19->data != local_90 ||
                      (uVar9 = mt_random(),
                      (uVar9 * -0x33333333 >> 1 | (uint)((uVar9 * -0x33333333 & 1) != 0) << 0x1f) <
                      0x1999999a)) || ((mtmp->field_0x62 & 2) == 0)) ||
                    ((uVar9 = mtmp->data->mflags1, (uVar9 >> 0xc & 1) != 0 ||
                     ((*(uint *)&pmVar19->field_0x60 >> 0x11 & 1) == 0)))) ||
                   ((uVar31 = local_148, (uVar9 >> 0x18 & 1) == 0 &&
                    ((*(uint *)&pmVar19->field_0x60 & 2) != 0)))))) &&
                 ((pmVar19->data != local_98 ||
                  (uVar9 = mt_random(), uVar31 = local_148,
                  (uVar9 * -0x33333333 >> 1 | (uint)((uVar9 * -0x33333333 & 1) != 0) << 0x1f) <
                  0x1999999a)))) {
                iVar22 = max_passive_dmg(pmVar19,mtmp);
                uVar31 = local_148;
                if ((iVar22 < mtmp->mhp) &&
                   (((((mtmp->mhpmax <= mtmp->mhp * 4 &&
                       (uVar5 = pmVar19->data->msound, uVar5 != '!')) && (uVar5 != '\x1f')) ||
                     ((((pmVar19->field_0x62 & 0x40) == 0 || (u.uprops[0x15].intrinsic != 0)) ||
                      (u.uprops[0x15].extrinsic != 0)))) &&
                    ((ppVar6 = pmVar19->data, ppVar6 != local_a0 || ((mtmp->mintrinsics & 8) != 0)))
                    ))) {
                  if (ppVar6 == mons + 0xb || ppVar6 == mons + 0xc) {
                    bVar34 = (mtmp->mintrinsics & 0x80) == 0;
                    local_150 = (monst *)((ulong)pmVar26 & 0xffffffff);
                    if (!bVar34) {
                      local_150 = (monst *)0x0;
                    }
                    bVar35 = local_fc == 0 && !bVar34;
                  }
                  else {
                    bVar34 = false;
                    local_150 = (monst *)0x0;
                    bVar35 = local_fc == 0;
                  }
                  if (bVar35) {
                    notonhead = '\0';
                    uVar9 = mattackm(mtmp,pmVar19);
                    if (((uVar9 & 4) == 0) &&
                       (((((uVar9 & 3) != 1 || (uVar9 = mt_random(), (uVar9 & 3) == 0)) ||
                         (pmVar19->mlstmv == moves)) ||
                        (((bVar8 = onscary((int)mtmp->mx,(int)mtmp->my,pmVar19), bVar8 != '\0' ||
                          (bVar8 = monnear(pmVar19,(int)mtmp->mx,(int)mtmp->my), bVar8 == '\0')) ||
                         (uVar9 = mattackm(pmVar19,mtmp), (uVar9 & 2) == 0)))))) {
                      local_150 = (monst *)0x0;
                    }
                    else {
                      local_150 = (monst *)0x2;
                    }
                    bVar34 = false;
                  }
                }
              }
              if (!bVar34) goto LAB_00176345;
            }
          }
LAB_00175cce:
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar31);
        pmVar26 = (monst *)0x0;
        obj = local_150;
        cVar21 = (char)local_110;
        iVar22 = (int)local_e8;
        cVar17 = (char)local_108;
      }
    }
LAB_00175e9a:
    iVar28 = (int)cVar21;
    if (cVar17 == cVar2 && cVar21 == cVar1) {
      if (((mtmp->field_0x63 & 1) != 0) &&
         (local_150 = obj, iVar22 = dist2(local_130,local_12c,(int)u.ux,(int)u.uy), 4 < iVar22)) {
        iVar22 = sgn(local_130 - u.ux);
        iVar28 = sgn(local_12c - (int)u.uy);
        local_152.x = u.ux + (char)iVar22;
        local_152.y = u.uy + (char)iVar28;
        bVar8 = goodpos(level,(int)local_152.x,(int)local_152.y,mtmp,0);
        if (bVar8 == '\0') {
          iVar22 = xytod((char)iVar22,(char)iVar28);
          uVar9 = iVar22 + 0xe;
          if (-1 < (int)(iVar22 + 7U)) {
            uVar9 = iVar22 + 7U;
          }
          iVar28 = (iVar22 - (uVar9 & 0xfffffff8)) + 7;
          uVar9 = iVar22 + 8;
          if (-1 < (int)(iVar22 + 1U)) {
            uVar9 = iVar22 + 1U;
          }
          iVar10 = (iVar22 - (uVar9 & 0xfffffff8)) + 1;
          if (iVar28 < iVar10) {
            do {
              dtoxy(&local_152,iVar28);
              bVar8 = goodpos(level,(int)local_152.x,(int)local_152.y,mtmp,0);
              if (bVar8 != '\0') goto LAB_0017604b;
              iVar28 = iVar28 + 1;
            } while (iVar10 != iVar28);
          }
          uVar9 = iVar22 + 0xd;
          if (-1 < (int)(iVar22 + 6U)) {
            uVar9 = iVar22 + 6U;
          }
          iVar28 = (iVar22 - (uVar9 & 0xfffffff8)) + 6;
          uVar9 = iVar22 + 9;
          if (-1 < (int)(iVar22 + 2U)) {
            uVar9 = iVar22 + 2U;
          }
          iVar22 = (iVar22 - (uVar9 & 0xfffffff8)) + 2;
          if (iVar28 < iVar22) {
            do {
              dtoxy(&local_152,iVar28);
              bVar8 = goodpos(level,(int)local_152.x,(int)local_152.y,mtmp,0);
              if (bVar8 != '\0') goto LAB_0017604b;
              iVar28 = iVar28 + 1;
            } while (iVar22 != iVar28);
          }
          local_152.x = mtmp->mx;
          local_152.y = mtmp->my;
        }
LAB_0017604b:
        bVar8 = m_in_out_region(mtmp,cVar21,cVar17);
        if (bVar8 == '\0') {
          local_150 = (monst *)0x1;
          goto LAB_00176345;
        }
        remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
        place_monster(mtmp,(int)local_152.x,(int)local_152.y);
        newsym((int)local_152.x,(int)local_152.y);
        set_apparxy(level,mtmp);
      }
    }
    else {
      if ((*(byte *)((long)&local_78 + (long)iVar22 * 8 + 2) & 4) == 0) {
        iVar10 = (int)cVar17;
        local_150 = obj;
        bVar8 = m_in_out_region(mtmp,cVar21,cVar17);
        if (bVar8 == '\0') {
          pmVar19 = (monst *)0x1;
          bVar34 = false;
        }
        else {
          lVar23 = (long)iVar28;
          lVar33 = (long)cVar17;
          local_138 = lVar23;
          local_120 = lVar33;
          if ((((level->locations[lVar23][lVar33].typ < '\x11') &&
               (bVar8 = may_dig(level,cVar21,cVar17), bVar8 != '\0')) ||
              (bVar8 = closed_door(level,iVar28,iVar10), bVar8 != '\0')) &&
             ((mtmp->weapon_check != '\0' && ((~mtmp->data->mflags1 & 0x60) == 0)))) {
            bVar8 = closed_door(level,iVar28,iVar10);
            xVar20 = '\x06';
            if (bVar8 == '\0') {
              cVar21 = level->locations[lVar23][lVar33].typ;
              if ((cVar21 == '\r') ||
                 ((cVar21 == '\0' && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0)))) {
                poVar14 = mtmp->mw;
                xVar20 = '\x05';
                if ((poVar14 == (obj *)0x0) ||
                   (((byte)(poVar14->oclass | 4U) != 6 ||
                    (objects[poVar14->otyp].oc_subtyp != '\x03')))) goto LAB_0017617c;
              }
              else {
                poVar14 = mtmp->mw;
                xVar20 = '\x04';
                if ((poVar14 == (obj *)0x0) ||
                   (((byte)(poVar14->oclass | 4U) != 6 ||
                    (objects[poVar14->otyp].oc_subtyp != '\x04')))) goto LAB_0017617c;
              }
            }
            else {
LAB_0017617c:
              mtmp->weapon_check = xVar20;
            }
            if ('\x03' < mtmp->weapon_check) {
              iVar13 = mon_wield_item(mtmp);
              bVar34 = false;
              pmVar19 = (monst *)0x0;
              if (iVar13 != 0) goto LAB_001762ee;
            }
          }
          remove_monster(level,local_130,local_12c);
          place_monster(mtmp,iVar28,iVar10);
          if ((local_f1[iVar22] != '\0') &&
             (((viz_array[local_88][local_80] & 2U) != 0 ||
              ((viz_array[local_120][local_138] & 2U) != 0)))) {
            pcVar25 = Monnam(mtmp);
            pline("%s moves only reluctantly.",pcVar25);
          }
          pmVar19 = local_150;
          mtmp->mtrack[3] = mtmp->mtrack[2];
          *(undefined4 *)(mtmp->mtrack + 1) = *(undefined4 *)mtmp->mtrack;
          mtmp->mtrack[0].x = cVar1;
          mtmp->mtrack[0].y = cVar2;
          if ((char)local_118 == '\0') {
            bVar34 = false;
            iVar22 = dog_eat(mtmp,(obj *)pmVar26,local_130,local_12c,'\0');
            if (iVar22 == 2) {
              pmVar19 = (monst *)0x2;
              goto LAB_001762ee;
            }
          }
          bVar34 = true;
          pmVar19 = (monst *)((ulong)pmVar19 & 0xffffffff);
        }
      }
      else {
        if ((mtmp->field_0x63 & 1) != 0) {
          pcVar25 = Monnam(mtmp);
          iVar22 = pronoun_gender(level,mtmp);
          pline("%s breaks loose of %s leash!",pcVar25,genders[iVar22].his);
          m_unleash(mtmp,'\0');
        }
        mattacku(mtmp);
        bVar34 = false;
        pmVar19 = (monst *)0x0;
      }
LAB_001762ee:
      local_150 = pmVar19;
      if (!bVar34) goto LAB_00176345;
    }
  }
  else {
    pmVar26 = (monst *)0x4;
    iVar22 = resist(mtmp,'\x04',0,0);
    if (iVar22 != 0) goto LAB_00174bd8;
    dismount_steed(2);
  }
  local_150 = (monst *)0x1;
LAB_00176345:
  return (int)local_150;
}

Assistant:

int dog_move(struct monst *mtmp, 
	     int after)	/* this is extra fast monster movement */
{
	int omx, omy;		/* original mtmp position */
	int appr, whappr, udist;
	int i, j, k;
	struct edog *edog = EDOG(mtmp);
	struct obj *obj = NULL;
	xchar otyp;
	boolean has_edog, cursemsg[9], do_eat = FALSE;
	xchar nix, niy;		/* position mtmp is (considering) moving to */
	int nx, ny;	/* temporary coordinates */
	xchar cnt, uncursedcnt, chcnt;
	int chi = -1, nidist, ndist;
	coord poss[9];
	long info[9], allowflags;
#define GDIST(x,y) (dist2(x,y,gx,gy))

	/*
	 * Tame Angels have isminion set and an ispriest structure instead of
	 * an edog structure.  Fortunately, guardian Angels need not worry
	 * about mundane things like eating and fetching objects, and can
	 * spend all their energy defending the player.  (They are the only
	 * monsters with other structures that can be tame.)
	 */
	has_edog = !mtmp->isminion;

	omx = mtmp->mx;
	omy = mtmp->my;
	if (has_edog && dog_hunger(mtmp, edog)) return 2;	/* starved */

	udist = distu(omx,omy);
	/* Let steeds eat and maybe throw rider during Conflict */
	if (mtmp == u.usteed) {
	    if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
		dismount_steed(DISMOUNT_THROWN);
		return 1;
	    }
	    udist = 1;
	} else if (!udist)
	/* maybe we tamed him while being swallowed --jgm */
		return 0;

	nix = omx;	/* set before newdogpos */
	niy = omy;
	cursemsg[0] = FALSE;	/* lint suppression */
	info[0] = 0;		/* ditto */

	if (has_edog) {
	    j = dog_invent(mtmp, edog, udist);
	    if (j == 2) return 2;		/* died */
	    else if (j == 1) goto newdogpos;	/* eating something */

	    whappr = (moves - edog->whistletime < 5);
	} else
	    whappr = 0;

	appr = dog_goal(mtmp, has_edog ? edog : NULL,
							after, udist, whappr);
	if (appr == -2) return 0;

	allowflags = ALLOW_M | ALLOW_TRAPS | ALLOW_SSM | ALLOW_SANCT;
	if (passes_walls(mtmp->data)) allowflags |= (ALLOW_ROCK | ALLOW_WALL);
	if (passes_bars(mtmp->data) || metallivorous(mtmp->data))
	    allowflags |= ALLOW_BARS;
	if (throws_rocks(mtmp->data)) allowflags |= ALLOW_ROCK;
	if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
	    allowflags |= ALLOW_U;
	    if (!has_edog) {
		coord mm;
		/* Guardian angel refuses to be conflicted; rather,
		 * it disappears, angrily, and sends in some nasties
		 */
		if (canspotmon(level, mtmp)) {
		    pline("%s rebukes you, saying:", Monnam(mtmp));
		    verbalize("Since you desire conflict, have some more!");
		}
		mongone(mtmp);
		i = rnd(4);
		while (i--) {
		    mm.x = u.ux;
		    mm.y = u.uy;
		    if (enexto(&mm, level, mm.x, mm.y, &mons[PM_ANGEL]))
			mk_roamer(&mons[PM_ANGEL], u.ualign.type,
					 level, mm.x, mm.y, FALSE);
		}
		return 2;

	    }
	}
	if (!Conflict && !mtmp->mconf &&
	    mtmp == u.ustuck && !sticks(youmonst.data)) {
	    unstuck(mtmp);	/* swallowed case handled above */
	    pline("You get released!");
	}
	if (!nohands(mtmp->data) && !verysmall(mtmp->data)) {
		allowflags |= OPENDOOR;
		if (m_carrying(mtmp, SKELETON_KEY)) allowflags |= BUSTDOOR;
	}
	if (is_giant(mtmp->data)) allowflags |= BUSTDOOR;
	if (tunnels(mtmp->data)) allowflags |= ALLOW_DIG;
	cnt = mfndpos(mtmp, poss, info, allowflags);

	/* Normally dogs don't step on cursed items, but if they have no
	 * other choice they will.  This requires checking ahead of time
	 * to see how many uncursed item squares are around.
	 */
	uncursedcnt = 0;
	for (i = 0; i < cnt; i++) {
		nx = poss[i].x; ny = poss[i].y;
		if (MON_AT(level, nx,ny) && !(info[i] & ALLOW_M)) continue;
		if (cursed_object_at(nx, ny)) continue;
		uncursedcnt++;
	}

	chcnt = 0;
	chi = -1;
	nidist = GDIST(nix,niy);

	for (i = 0; i < cnt; i++) {
		nx = poss[i].x;
		ny = poss[i].y;
		cursemsg[i] = FALSE;

		/* if leashed, we drag him along. */
		if (mtmp->mleashed && distu(nx, ny) > 4) continue;

		/* if a guardian, try to stay close by choice */
		if (!has_edog &&
		    (j = distu(nx, ny)) > 16 && j >= udist) continue;

		if ((info[i] & ALLOW_M) && MON_AT(level, nx, ny)) {
		    int mstatus;
		    struct monst *mtmp2 = m_at(level, nx,ny);

		    if ((int)mtmp2->m_lev >= (int)mtmp->m_lev+2 ||
			(mtmp2->data == &mons[PM_FLOATING_EYE] && rn2(10) &&
			 mtmp->mcansee && haseyes(mtmp->data) && mtmp2->mcansee
			 && (perceives(mtmp->data) || !mtmp2->minvis)) ||
			(mtmp2->data==&mons[PM_GELATINOUS_CUBE] && rn2(10)) ||
			(max_passive_dmg(mtmp2, mtmp) >= mtmp->mhp) ||
			((mtmp->mhp*4 < mtmp->mhpmax
			  || mtmp2->data->msound == MS_GUARDIAN
			  || mtmp2->data->msound == MS_LEADER) &&
			 mtmp2->mpeaceful && !Conflict) ||
			(touch_disintegrates(mtmp2->data) &&
			 !resists_disint(mtmp)) ||
			(touch_petrifies(mtmp2->data) &&
			 !resists_ston(mtmp)))
			continue;

		    if (after) return 0; /* hit only once each move */

		    notonhead = 0;
		    mstatus = mattackm(mtmp, mtmp2);

		    /* aggressor (pet) died */
		    if (mstatus & MM_AGR_DIED) return 2;

		    if ((mstatus & MM_HIT) && !(mstatus & MM_DEF_DIED) &&
			    rn2(4) && mtmp2->mlstmv != moves &&
			    !onscary(mtmp->mx, mtmp->my, mtmp2) &&
			    /* monnear check needed: long worms hit on tail */
			    monnear(mtmp2, mtmp->mx, mtmp->my)) {
			mstatus = mattackm(mtmp2, mtmp);  /* return attack */
			if (mstatus & MM_DEF_DIED) return 2;
		    }

		    return 0;
		}

		{   /* Dog avoids harmful traps, but perhaps it has to pass one
		     * in order to follow player.  (Non-harmful traps do not
		     * have ALLOW_TRAPS in info[].)  The dog only avoids the
		     * trap if you've seen it, unlike enemies who avoid traps
		     * if they've seen some trap of that type sometime in the
		     * past.  (Neither behavior is really realistic.)
		     */
		    struct trap *trap;

		    if ((info[i] & ALLOW_TRAPS) && (trap = t_at(level, nx, ny))) {
			if (mtmp->mleashed) {
			    if (flags.soundok) whimper(mtmp);
			} else
			    /* 1/40 chance of stepping on it anyway, in case
			     * it has to pass one to follow the player...
			     */
			    if (trap->tseen && rn2(40)) continue;
		    }
		}

		/* dog eschews cursed objects, but likes dog food */
		/* (minion isn't interested; `cursemsg' stays FALSE) */
		if (has_edog)
		for (obj = level->objects[nx][ny]; obj; obj = obj->nexthere) {
		    if (obj->cursed) cursemsg[i] = TRUE;
		    else if ((otyp = dogfood(mtmp, obj)) < MANFOOD &&
			     (otyp < ACCFOOD || edog->hungrytime <= moves)) {
			/* Note: our dog likes the food so much that he
			 * might eat it even when it conceals a cursed object */
			nix = nx;
			niy = ny;
			chi = i;
			do_eat = TRUE;
			cursemsg[i] = FALSE;	/* not reluctant */
			goto newdogpos;
		    }
		}
		/* didn't find something to eat; if we saw a cursed item and
		   aren't being forced to walk on it, usually keep looking */
		if (cursemsg[i] && !mtmp->mleashed && uncursedcnt > 0 &&
		    rn2(13 * uncursedcnt)) continue;

		/* lessen the chance of backtracking to previous position(s) */
		k = has_edog ? uncursedcnt : cnt;
		for (j = 0; j < MTSZ && j < k - 1; j++)
			if (nx == mtmp->mtrack[j].x && ny == mtmp->mtrack[j].y)
				if (rn2(MTSZ * (k - j))) goto nxti;

		j = ((ndist = GDIST(nx,ny)) - nidist) * appr;
		if ((j == 0 && !rn2(++chcnt)) || j < 0 ||
			(j > 0 && !whappr &&
				((omx == nix && omy == niy && !rn2(3))
					|| !rn2(12))
			)) {
			nix = nx;
			niy = ny;
			nidist = ndist;
			if (j < 0) chcnt = 0;
			chi = i;
		}
	nxti:	;
	}
newdogpos:
	if (nix != omx || niy != omy) {
		struct obj *mw_tmp;

		if (info[chi] & ALLOW_U) {
			if (mtmp->mleashed) { /* play it safe */
				pline("%s breaks loose of %s leash!",
				      Monnam(mtmp), mhis(level, mtmp));
				m_unleash(mtmp, FALSE);
			}
			mattacku(mtmp);
			return 0;
		}
		if (!m_in_out_region(mtmp, nix, niy))
		    return 1;
		if (((IS_ROCK(level->locations[nix][niy].typ) && may_dig(level, nix,niy)) ||
		     closed_door(level, nix, niy)) &&
		    mtmp->weapon_check != NO_WEAPON_WANTED &&
		    tunnels(mtmp->data) && needspick(mtmp->data)) {
		    if (closed_door(level, nix, niy)) {
			if (!(mw_tmp = MON_WEP(mtmp)) ||
			    !is_pick(mw_tmp) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_PICK_OR_AXE;
		    } else if (IS_TREE(level, level->locations[nix][niy].typ)) {
			if (!(mw_tmp = MON_WEP(mtmp)) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_AXE;
		    } else if (!(mw_tmp = MON_WEP(mtmp)) || !is_pick(mw_tmp)) {
			mtmp->weapon_check = NEED_PICK_AXE;
		    }
		    if (mtmp->weapon_check >= NEED_PICK_AXE &&
			mon_wield_item(mtmp))
			return 0;
		}
		/* insert a worm_move() if worms ever begin to eat things */
		remove_monster(level, omx, omy);
		place_monster(mtmp, nix, niy);
		if (cursemsg[chi] && (cansee(omx,omy) || cansee(nix,niy)))
			pline("%s moves only reluctantly.", Monnam(mtmp));
		for (j=MTSZ-1; j>0; j--) mtmp->mtrack[j] = mtmp->mtrack[j-1];
		mtmp->mtrack[0].x = omx;
		mtmp->mtrack[0].y = omy;
		/* We have to know if the pet's gonna do a combined eat and
		 * move before moving it, but it can't eat until after being
		 * moved.  Thus the do_eat flag.
		 */
		if (do_eat) {
		    if (dog_eat(mtmp, obj, omx, omy, FALSE) == 2) return 2;
		}
	} else if (mtmp->mleashed && distu(omx, omy) > 4) {
		/* an incredible kludge, but the only way to keep pooch near
		 * after it spends time eating or in a trap, etc.
		 */
		coord cc;

		nx = sgn(omx - u.ux);
		ny = sgn(omy - u.uy);
		cc.x = u.ux + nx;
		cc.y = u.uy + ny;
		if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;

		i  = xytod(nx, ny);
		for (j = (i + 7)%8; j < (i + 1)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		for (j = (i + 6)%8; j < (i + 2)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		cc.x = mtmp->mx;
		cc.y = mtmp->my;
dognext:
		if (!m_in_out_region(mtmp, nix, niy))
		  return 1;
		remove_monster(level, mtmp->mx, mtmp->my);
		place_monster(mtmp, cc.x, cc.y);
		newsym(cc.x,cc.y);
		set_apparxy(level, mtmp);
	}
	return 1;
}